

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitSIMDLoadStoreLane
          (PrintExpressionContents *this,SIMDLoadStoreLane *curr)

{
  ulong uVar1;
  Index IVar2;
  ostream *poVar3;
  Module *in_R8;
  Name name;
  
  prepareColor(this->o);
  if ((ulong)curr->op < 8) {
    std::operator<<(this->o,&DAT_00e241bc + *(int *)(&DAT_00e241bc + (ulong)curr->op * 4));
  }
  Colors::normal(this->o);
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  if ((curr->offset).addr != 0) {
    poVar3 = std::operator<<(this->o," offset=");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  }
  uVar1 = (curr->align).addr;
  IVar2 = SIMDLoadStoreLane::getMemBytes(curr);
  if (uVar1 != IVar2) {
    poVar3 = std::operator<<(this->o," align=");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  }
  poVar3 = std::operator<<(this->o," ");
  std::ostream::operator<<(poVar3,(uint)curr->index);
  return;
}

Assistant:

void visitSIMDLoadStoreLane(SIMDLoadStoreLane* curr) {
    prepareColor(o);
    switch (curr->op) {
      case Load8LaneVec128:
        o << "v128.load8_lane";
        break;
      case Load16LaneVec128:
        o << "v128.load16_lane";
        break;
      case Load32LaneVec128:
        o << "v128.load32_lane";
        break;
      case Load64LaneVec128:
        o << "v128.load64_lane";
        break;
      case Store8LaneVec128:
        o << "v128.store8_lane";
        break;
      case Store16LaneVec128:
        o << "v128.store16_lane";
        break;
      case Store32LaneVec128:
        o << "v128.store32_lane";
        break;
      case Store64LaneVec128:
        o << "v128.store64_lane";
        break;
    }
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
    if (curr->align != curr->getMemBytes()) {
      o << " align=" << curr->align;
    }
    o << " " << int(curr->index);
  }